

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  int *piVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<BoozdedZomby::Zomby> boozdedZomby;
  shared_ptr<Common::WriteToConsoleListener> writeToConsoleListener;
  ostringstream buf;
  Zomby *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  undefined1 local_1c8 [32];
  shared_ptr<Common::Listener> local_1a8;
  shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_198;
  timespec local_188 [7];
  ios_base local_118 [264];
  
  Common::WriteToConsoleListener::instance();
  BoozdedZomby::Zomby::create();
  local_1a8.super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1c8._16_8_;
  local_1a8.super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._24_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_1c8._24_8_ + 8) = *(_Atomic_word *)(local_1c8._24_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_1c8._24_8_ + 8) = *(_Atomic_word *)(local_1c8._24_8_ + 8) + 1;
    }
  }
  BoozdedZomby::Zomby::runOnce(local_1d8,&local_1a8);
  if (local_1a8.super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<Common::Listener,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_188[0].tv_sec = 4;
  local_188[0].tv_nsec = 500000000;
  do {
    iVar1 = nanosleep(local_188,local_188);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"============================================================\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"|                      Zomby was killed                    |\n",
             0x3d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,"============================================================\n",
             0x3d);
  if ((WriteToConsoleListener *)local_1c8._16_8_ != (WriteToConsoleListener *)0x0) {
    std::__cxx11::stringbuf::str();
    local_198.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
    (local_198.
     super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_use_count = 1;
    (local_198.
     super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_M_weak_count = 1;
    (local_198.
     super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
     ._M_refcount._M_pi)->_vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00106c50;
    local_198.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              (local_198.
               super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi + 1);
    p_Var3 = local_198.
             super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 2;
    local_198.
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)p_Var3;
    if (local_1d8 == (Zomby *)local_1c8) {
      p_Var3->_vptr__Sp_counted_base = (_func_int **)CONCAT71(local_1c8._1_7_,local_1c8[0]);
      local_198.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[2]._M_use_count = local_1c8._8_4_;
      local_198.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[2]._M_weak_count = local_1c8._12_4_;
    }
    else {
      *(Zomby **)
       local_198.
       super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr = local_1d8;
      p_Var3->_vptr__Sp_counted_base = (_func_int **)CONCAT71(local_1c8._1_7_,local_1c8[0]);
    }
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
     &local_198.
      super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi[1]._M_use_count = local_1d0;
    local_1c8[0] = 0;
    Common::WriteToConsoleListener::processData
              ((WriteToConsoleListener *)local_1c8._16_8_,&local_198);
    if (local_198.
        super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.
                 super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  local_188[0].tv_sec = 5;
  local_188[0].tv_nsec = 0;
  do {
    iVar1 = nanosleep(local_188,local_188);
    if (iVar1 != -1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._24_8_);
  }
  return 0;
}

Assistant:

int main()
{
    auto writeToConsoleListener = Common::WriteToConsoleListener::instance();

    {
        auto boozdedZomby = BoozdedZomby::Zomby::create();
        boozdedZomby->runOnce(writeToConsoleListener);

        std::this_thread::sleep_for(std::chrono::milliseconds(4500));
    } // Zombies should be killed here

    {
        std::ostringstream buf;
        buf << "============================================================\n"
            << "|                      Zomby was killed                    |\n"
            << "============================================================\n";
        if (writeToConsoleListener) {
            writeToConsoleListener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
        }
    }

    std::this_thread::sleep_for(std::chrono::milliseconds(5000));

    return 0;
}